

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::MulAddLeft
              (Var mulLeft,Var mulRight,Var addLeft,ScriptContext *scriptContext,
              JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  JavascriptLibrary *pJVar3;
  StaticType *pSVar4;
  double dVar5;
  double dVar6;
  JavascriptNumber local_70;
  JavascriptNumber mulTemp;
  Var aMul;
  double mulResult_3;
  double mulResult_2;
  double mulResult_1;
  Var mulResult;
  JavascriptNumber mulTemp_1;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var addLeft_local;
  Var mulRight_local;
  Var mulLeft_local;
  
  mulTemp_1.m_value = (double)result;
  bVar1 = TaggedInt::Is(mulLeft);
  if (bVar1) {
    bVar1 = TaggedInt::Is(mulRight);
    if (bVar1) {
      pJVar3 = ScriptContext::GetLibrary(scriptContext);
      pSVar4 = JavascriptLibrary::GetNumberTypeStatic(pJVar3);
      JavascriptNumber::JavascriptNumber((JavascriptNumber *)&mulResult,0.0,pSVar4,false);
      pvVar2 = TaggedInt::MultiplyInPlace
                         (mulLeft,mulRight,scriptContext,(JavascriptNumber *)&mulResult);
      if (mulTemp_1.m_value != 0.0) {
        pvVar2 = Add_InPlace(addLeft,pvVar2,scriptContext,(JavascriptNumber *)mulTemp_1.m_value);
        return pvVar2;
      }
      pvVar2 = Add_Full(addLeft,pvVar2,scriptContext);
      return pvVar2;
    }
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(mulRight);
    if (bVar1) {
      dVar5 = TaggedInt::ToDouble(mulLeft);
      dVar6 = JavascriptNumber::GetValue(mulRight);
      pvVar2 = Add_DoubleHelper(addLeft,dVar5 * dVar6,scriptContext,
                                (JavascriptNumber *)mulTemp_1.m_value);
      return pvVar2;
    }
  }
  else {
    bVar1 = TaggedInt::Is(mulRight);
    if (bVar1) {
      bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(mulLeft);
      if (bVar1) {
        dVar5 = JavascriptNumber::GetValue(mulLeft);
        dVar6 = TaggedInt::ToDouble(mulRight);
        pvVar2 = Add_DoubleHelper(addLeft,dVar5 * dVar6,scriptContext,
                                  (JavascriptNumber *)mulTemp_1.m_value);
        return pvVar2;
      }
    }
    else {
      bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(mulLeft);
      if ((bVar1) && (bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(mulRight), bVar1)) {
        dVar5 = JavascriptNumber::GetValue(mulLeft);
        dVar6 = JavascriptNumber::GetValue(mulRight);
        pvVar2 = Add_DoubleHelper(addLeft,dVar5 * dVar6,scriptContext,
                                  (JavascriptNumber *)mulTemp_1.m_value);
        return pvVar2;
      }
    }
  }
  pJVar3 = ScriptContext::GetLibrary(scriptContext);
  pSVar4 = JavascriptLibrary::GetNumberTypeStatic(pJVar3);
  JavascriptNumber::JavascriptNumber(&local_70,0.0,pSVar4,false);
  mulTemp.m_value = (double)Multiply_InPlace(mulLeft,mulRight,scriptContext,&local_70);
  if (mulTemp_1.m_value == 0.0) {
    mulLeft_local = Add_Full(addLeft,(Var)mulTemp.m_value,scriptContext);
  }
  else {
    mulLeft_local =
         Add_InPlace(addLeft,(Var)mulTemp.m_value,scriptContext,
                     (JavascriptNumber *)mulTemp_1.m_value);
  }
  return mulLeft_local;
}

Assistant:

Var JavascriptMath::MulAddLeft(Var mulLeft, Var mulRight, Var addLeft, ScriptContext* scriptContext,  JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MulAddLeft);
            if(TaggedInt::Is(mulLeft))
            {
                if(TaggedInt::Is(mulRight))
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
                    JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
                    Var mulResult = TaggedInt::MultiplyInPlace(mulLeft, mulRight, scriptContext, &mulTemp);

                    if (result)
                    {
                        return JavascriptMath::Add_InPlace(addLeft, mulResult, scriptContext, result);
                    }
                    else
                    {
                        return JavascriptMath::Add_Full(addLeft, mulResult, scriptContext);
                    }
                }
                else if(JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
                {
                    double mulResult = TaggedInt::ToDouble(mulLeft) * JavascriptNumber::GetValue(mulRight);

                    return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
                }
            }
            else if(TaggedInt::Is(mulRight))
            {
                if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft))
                {
                    double mulResult = JavascriptNumber::GetValue(mulLeft) * TaggedInt::ToDouble(mulRight);

                    return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
                }
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(mulLeft) && JavascriptNumber::Is_NoTaggedIntCheck(mulRight))
            {
                double mulResult = JavascriptNumber::GetValue(mulLeft) * JavascriptNumber::GetValue(mulRight);

                return JavascriptMath::Add_DoubleHelper(addLeft, mulResult, scriptContext, result);
            }

            Var aMul;
            JavascriptNumber mulTemp(0, scriptContext->GetLibrary()->GetNumberTypeStatic());
            aMul = JavascriptMath::Multiply_InPlace(mulLeft, mulRight, scriptContext, &mulTemp);
            if (result)
            {
                return JavascriptMath::Add_InPlace(addLeft, aMul, scriptContext, result);
            }
            else
            {
                return JavascriptMath::Add_Full(addLeft, aMul, scriptContext);
            }
            JIT_HELPER_END(Op_MulAddLeft);
        }